

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_shift_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_unary_expression(this);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = match(this,TK_SLL);
        if (!bVar1) break;
        Token::operator=(&oper,(this->matched)._M_current);
        pEVar2 = (Expression *)operator_new(0x68);
        pEVar3 = parse_unary_expression(this);
        ShiftLeftLogicalExpression::ShiftLeftLogicalExpression
                  ((ShiftLeftLogicalExpression *)pEVar2,&oper,left,pEVar3);
        left = pEVar2;
      }
      bVar1 = match(this,TK_SRL);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_unary_expression(this);
      ShiftRightLogicalExpression::ShiftRightLogicalExpression
                ((ShiftRightLogicalExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_SRA);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_unary_expression(this);
    ShiftRightArithmeticExpression::ShiftRightArithmeticExpression
              ((ShiftRightArithmeticExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression* Parser::parse_shift_expression() {
    Token oper;
    Expression* expression = parse_unary_expression();

    while (true) {
        if (match(TK_SLL)) {
            oper = *matched;
            expression = new ShiftLeftLogicalExpression(oper, expression, parse_unary_expression());
        } else if (match(TK_SRL)) {
            oper = *matched;
            expression = new ShiftRightLogicalExpression(oper, expression, parse_unary_expression());
        } else if (match(TK_SRA)) {
            oper = *matched;
            expression = new ShiftRightArithmeticExpression(oper, expression, parse_unary_expression());
        } else {
            break;
        }
    }

    return expression;
}